

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O1

int Sfm_TimReadObjDelay(Sfm_Tim_t *p,int iObj)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  
  if (iObj < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar5 = iObj * 2;
  uVar1 = (p->vTimArrs).nSize;
  if (uVar1 != uVar5 && SBORROW4(uVar1,uVar5) == (int)(uVar1 + iObj * -2) < 0) {
    piVar4 = (p->vTimArrs).pArray;
    iVar2 = piVar4[uVar5];
    iVar3 = piVar4[(ulong)uVar5 + 1];
    if (iVar3 < iVar2) {
      iVar3 = iVar2;
    }
    return iVar3;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

int Sfm_TimReadObjDelay( Sfm_Tim_t * p, int iObj )
{
    return Sfm_TimArrMaxId(p, iObj);
}